

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abs.c
# Opt level: O1

rt_function_error_t allocate_abs_local_context(rt_function_t *f)

{
  rt_variable_t *prVar1;
  rt_function_error_t rVar2;
  int iVar3;
  long *plVar4;
  rt_variable_getter p_Var5;
  rt_variable_setter p_Var6;
  code *pcVar7;
  rt_list_t shape;
  rt_list_t shape_00;
  
  rVar2 = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  if ((f->num_of_inputs == 1) &&
     (rVar2 = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS, f->num_of_outputs == 1)) {
    plVar4 = (long *)(*rt_malloc_func)(0x28);
    if (plVar4 == (long *)0x0) {
      rVar2 = RT_FUNCTION_ERROR_MALLOC;
    }
    else {
      f->local_context = plVar4;
      prVar1 = *f->inputs;
      *plVar4 = (long)prVar1;
      p_Var5 = select_getter(prVar1);
      plVar4[1] = (long)p_Var5;
      shape._4_4_ = 0;
      shape.size = ((*f->inputs)->shape).size;
      shape.data = ((*f->inputs)->shape).data;
      iVar3 = calc_shape_size(shape);
      *(int *)(plVar4 + 4) = iVar3;
      prVar1 = *f->outputs;
      plVar4[2] = (long)prVar1;
      p_Var6 = select_setter(prVar1);
      plVar4[3] = (long)p_Var6;
      shape_00._4_4_ = 0;
      shape_00.size = ((*f->outputs)->shape).size;
      shape_00.data = ((*f->outputs)->shape).data;
      iVar3 = calc_shape_size(shape_00);
      *(int *)((long)plVar4 + 0x24) = iVar3;
      rVar2 = RT_FUNCTION_ERROR_INVALID_SHAPE;
      if ((int)plVar4[4] == iVar3) {
        if (((*(byte *)(*plVar4 + 0x10) & 0xf) == 0) && ((*(byte *)(plVar4[2] + 0x10) & 0xf) == 0))
        {
          pcVar7 = exec_abs;
        }
        else {
          pcVar7 = exec_abs_generic;
        }
        f->exec_func = pcVar7;
        rVar2 = RT_FUNCTION_ERROR_NOERROR;
      }
    }
  }
  return rVar2;
}

Assistant:

rt_function_error_t allocate_abs_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  abs_private_t *p = rt_malloc_func(sizeof(abs_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }

  f->local_context = (void *)p;
  p->input = f->inputs[0];
  p->get_input = select_getter(p->input);
  p->input_size = calc_shape_size(f->inputs[0]->shape);

  p->output = f->outputs[0];
  p->set_output = select_setter(p->output);
  p->output_size = calc_shape_size(f->outputs[0]->shape);

  if (p->input_size != p->output_size) {
    return RT_FUNCTION_ERROR_INVALID_SHAPE;
  }
  if (p->input->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_ABS_FLOAT32
    f->exec_func = exec_abs;
#endif /* CONFIG_ABS_FLOAT32 */
  } else {
#ifdef CONFIG_ABS_GENERIC
    f->exec_func = exec_abs_generic;
#endif /* CONFIG_ABS_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}